

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_model_based_conversion.cc
# Opt level: O3

void __thiscall
sptk::GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion
          (GaussianMixtureModelBasedConversion *this,int num_source_order,int num_target_order,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *window_coefficients,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,bool use_magic_number,double magic_number)

{
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *this_00;
  uint uVar1;
  pointer pvVar2;
  void *__src;
  long lVar3;
  pointer pMVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  double *pdVar8;
  long lVar9;
  int m;
  long lVar10;
  ulong uVar11;
  int m_1;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  SymmetricMatrix xx;
  double local_100;
  Row local_f0;
  int local_d4;
  double local_d0;
  int local_c4;
  undefined1 local_c0 [16];
  int local_b0;
  Row local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_68;
  long local_60;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_58;
  vector<sptk::Matrix,_std::allocator<sptk::Matrix>_> *local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  this->_vptr_GaussianMixtureModelBasedConversion =
       (_func_int **)&PTR__GaussianMixtureModelBasedConversion_0011fa00;
  this->num_source_order_ = num_source_order;
  this->num_target_order_ = num_target_order;
  iVar6 = (int)((ulong)((long)(window_coefficients->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(window_coefficients->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + 1;
  this->source_length_ = (num_source_order + 1) * iVar6;
  this->target_length_ = (num_target_order + 1) * iVar6;
  local_38 = &this->weights_;
  local_68 = mean_vectors;
  std::vector<double,_std::allocator<double>_>::vector(local_38,weights);
  this->use_magic_number_ = use_magic_number;
  this->magic_number_ = magic_number;
  this->num_mixture_ =
       (int)((ulong)((long)(this->weights_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->weights_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3);
  NonrecursiveMaximumLikelihoodParameterGeneration::NonrecursiveMaximumLikelihoodParameterGeneration
            (&this->mlpg_,this->num_target_order_,window_coefficients,use_magic_number,magic_number)
  ;
  this->is_valid_ = true;
  iVar6 = this->num_mixture_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_c0,(long)this->source_length_,
             (allocator_type *)&local_f0);
  local_40 = &this->source_mean_vectors_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(local_40,(long)iVar6,(value_type *)local_c0,(allocator_type *)&local_80);
  if ((_func_int **)local_c0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_c0._0_8_);
  }
  iVar6 = this->num_mixture_;
  SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_c0,this->source_length_);
  this_00 = &this->source_covariance_matrices_;
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            (this_00,(long)iVar6,(value_type *)local_c0,(allocator_type *)&local_f0);
  SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_c0);
  iVar6 = this->num_mixture_;
  Matrix::Matrix((Matrix *)local_c0,this->target_length_,this->source_length_);
  local_50 = &this->e_slope_;
  std::vector<sptk::Matrix,_std::allocator<sptk::Matrix>_>::vector
            (local_50,(long)iVar6,(value_type *)local_c0,(allocator_type *)&local_f0);
  Matrix::~Matrix((Matrix *)local_c0);
  iVar6 = this->num_mixture_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_c0,(long)this->target_length_,
             (allocator_type *)&local_f0);
  local_48 = &this->e_bias_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(local_48,(long)iVar6,(value_type *)local_c0,(allocator_type *)&local_80);
  if ((_func_int **)local_c0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_c0._0_8_);
  }
  iVar6 = this->num_mixture_;
  SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_c0,this->target_length_);
  local_58 = &this->d_;
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            (local_58,(long)iVar6,(value_type *)local_c0,(allocator_type *)&local_f0);
  SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_c0);
  if ((((this->num_source_order_ < 0) || (this->num_target_order_ < 0)) || (this->num_mixture_ < 1))
     || ((this->mlpg_).is_valid_ != true)) {
LAB_0010785d:
    this->is_valid_ = false;
  }
  else {
    lVar10 = 0;
    do {
      iVar6 = this->source_length_;
      lVar9 = (long)this->target_length_ + (long)iVar6;
      pvVar2 = (local_68->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __src = pvVar2[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (((long)*(pointer *)
                  ((long)&pvVar2[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 8) - (long)__src >> 3 != lVar9) ||
         ((covariance_matrices->
          super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>)._M_impl
          .super__Vector_impl_data._M_start[lVar10].num_dimension_ != (int)lVar9))
      goto LAB_0010785d;
      local_60 = lVar10;
      if (iVar6 == 0) {
        iVar6 = 0;
      }
      else {
        memmove((this->source_mean_vectors_).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar10].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start,__src,(long)iVar6 << 3);
        iVar6 = this->source_length_;
        if (0 < iVar6) {
          iVar14 = 0;
          iVar12 = 1;
          do {
            iVar6 = 0;
            do {
              local_c0._8_8_ =
                   (covariance_matrices->
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar10;
              local_c0._0_8_ = &PTR__Row_0011fac0;
              local_b0 = iVar14;
              pdVar8 = SymmetricMatrix::Row::operator[]((Row *)local_c0,iVar6);
              dVar16 = *pdVar8;
              local_f0.matrix_ =
                   (this_00->
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar10;
              local_f0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
              local_f0.row_ = iVar14;
              pdVar8 = SymmetricMatrix::Row::operator[](&local_f0,iVar6);
              *pdVar8 = dVar16;
              iVar6 = iVar6 + 1;
            } while (iVar12 != iVar6);
            iVar14 = iVar14 + 1;
            iVar6 = this->source_length_;
            iVar12 = iVar12 + 1;
          } while (iVar14 < iVar6);
        }
      }
      SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_c0,iVar6);
      bVar5 = SymmetricMatrix::Invert
                        ((this_00->
                         super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar10,
                         (SymmetricMatrix *)local_c0);
      if (!bVar5) {
        this->is_valid_ = false;
        SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_c0);
        return;
      }
      uVar7 = this->target_length_;
      if (0 < (int)uVar7) {
        iVar6 = this->source_length_;
        lVar9 = 0;
        do {
          if (0 < iVar6) {
            iVar12 = iVar6 + (int)lVar9;
            lVar13 = 0;
            do {
              if (0 < iVar6) {
                iVar14 = 0;
                do {
                  local_f0.matrix_ =
                       (covariance_matrices->
                       super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar10;
                  local_f0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                  local_f0.row_ = iVar12;
                  pdVar8 = SymmetricMatrix::Row::operator[](&local_f0,iVar14);
                  dVar16 = *pdVar8;
                  local_80._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                  local_80.matrix_ = (SymmetricMatrix *)local_c0;
                  local_80.row_ = iVar14;
                  pdVar8 = SymmetricMatrix::Row::operator[](&local_80,(int)lVar13);
                  lVar3 = *(long *)(*(long *)&(this->e_slope_).
                                              super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                              index_.
                                              super__Vector_base<double_*,_std::allocator<double_*>_>
                                              ._M_impl + lVar9 * 8);
                  *(double *)(lVar3 + lVar13 * 8) =
                       dVar16 * *pdVar8 + *(double *)(lVar3 + lVar13 * 8);
                  iVar14 = iVar14 + 1;
                  iVar6 = this->source_length_;
                } while (iVar14 < iVar6);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < iVar6);
            uVar7 = this->target_length_;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (int)uVar7);
        if (0 < (int)uVar7) {
          uVar1 = this->source_length_;
          pMVar4 = (this->e_slope_).super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          lVar9 = *(long *)&(local_68->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[local_60].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data;
          lVar13 = *(long *)&(this->e_bias_).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_60].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          uVar11 = 0;
          do {
            if ((int)uVar1 < 1) {
              dVar16 = 0.0;
            }
            else {
              dVar16 = 0.0;
              uVar15 = 0;
              do {
                dVar16 = dVar16 + *(double *)
                                   (*(long *)(*(long *)&pMVar4[lVar10].index_.
                                                                                                                
                                                  super__Vector_base<double_*,_std::allocator<double_*>_>
                                                  ._M_impl.super__Vector_impl_data + uVar11 * 8) +
                                   uVar15 * 8) * *(double *)(lVar9 + uVar15 * 8);
                uVar15 = uVar15 + 1;
              } while (uVar1 != uVar15);
            }
            *(double *)(lVar13 + uVar11 * 8) =
                 *(double *)(lVar9 + (long)(int)uVar1 * 8 + uVar11 * 8) - dVar16;
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar7);
          if (0 < (int)uVar7) {
            local_d4 = 1;
            lVar9 = 0;
            do {
              iVar6 = this->source_length_;
              local_c4 = iVar6 + (int)lVar9;
              iVar12 = 0;
              while( true ) {
                if (iVar6 < 1) {
                  local_100 = 0.0;
                }
                else {
                  local_100 = 0.0;
                  lVar13 = 0;
                  do {
                    local_d0 = *(double *)
                                (*(long *)(*(long *)&(local_50->
                                                                                                          
                                                  super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[lVar10]
                                                  .index_.
                                                  super__Vector_base<double_*,_std::allocator<double_*>_>
                                                  ._M_impl + lVar9 * 8) + lVar13 * 8);
                    local_f0.matrix_ =
                         (covariance_matrices->
                         super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar10;
                    local_f0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                    local_f0.row_ = (int)lVar13;
                    pdVar8 = SymmetricMatrix::Row::operator[](&local_f0,iVar6 + iVar12);
                    local_100 = local_100 + local_d0 * *pdVar8;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < this->source_length_);
                }
                local_f0.matrix_ =
                     (covariance_matrices->
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar10;
                local_f0._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                local_f0.row_ = local_c4;
                pdVar8 = SymmetricMatrix::Row::operator[](&local_f0,iVar6 + iVar12);
                local_d0 = *pdVar8;
                local_80.matrix_ =
                     (local_58->
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar10;
                local_80._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                local_80.row_ = (int)lVar9;
                pdVar8 = SymmetricMatrix::Row::operator[](&local_80,iVar12);
                *pdVar8 = local_d0 - local_100;
                iVar12 = iVar12 + 1;
                if (iVar12 == local_d4) break;
                iVar6 = this->source_length_;
              }
              lVar9 = lVar9 + 1;
              local_d4 = local_d4 + 1;
            } while (lVar9 < this->target_length_);
          }
        }
      }
      SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_c0);
      lVar10 = local_60 + 1;
    } while (lVar10 < this->num_mixture_);
  }
  return;
}

Assistant:

GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion(
    int num_source_order, int num_target_order,
    const std::vector<std::vector<double> >& window_coefficients,
    const std::vector<double>& weights,
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    bool use_magic_number, double magic_number)
    : num_source_order_(num_source_order),
      num_target_order_(num_target_order),
      source_length_((num_source_order_ + 1) *
                     (static_cast<int>(window_coefficients.size() + 1))),
      target_length_((num_target_order_ + 1) *
                     (static_cast<int>(window_coefficients.size() + 1))),
      weights_(weights),
      use_magic_number_(use_magic_number),
      magic_number_(magic_number),
      num_mixture_(static_cast<int>(weights_.size())),
      mlpg_(num_target_order_, window_coefficients, use_magic_number_,
            magic_number_),
      is_valid_(true),
      source_mean_vectors_(num_mixture_, std::vector<double>(source_length_)),
      source_covariance_matrices_(num_mixture_,
                                  SymmetricMatrix(source_length_)),
      e_slope_(num_mixture_, Matrix(target_length_, source_length_)),
      e_bias_(num_mixture_, std::vector<double>(target_length_)),
      d_(num_mixture_, SymmetricMatrix(target_length_)) {
  if (num_source_order_ < 0 || num_target_order_ < 0 || num_mixture_ <= 0 ||
      !mlpg_.IsValid()) {
    is_valid_ = false;
    return;
  }

  for (int k(0); k < num_mixture_; ++k) {
    // Check size of mean vectors and covariance matrices.
    const int total_length(source_length_ + target_length_);
    if (mean_vectors[k].size() != static_cast<std::size_t>(total_length) ||
        covariance_matrices[k].GetNumDimension() != total_length) {
      is_valid_ = false;
      return;
    }

    // Set \mu^{(X)}.
    std::copy(mean_vectors[k].begin(), mean_vectors[k].begin() + source_length_,
              source_mean_vectors_[k].begin());

    // Set \Sigma^{(XX)}.
    for (int l(0); l < source_length_; ++l) {
      for (int m(0); m <= l; ++m) {
        source_covariance_matrices_[k][l][m] = covariance_matrices[k][l][m];
      }
    }

    // Set \Sigma^{(YX)} \Sigma^{(XX)}^{-1}.
    SymmetricMatrix xx(source_length_);
    if (!source_covariance_matrices_[k].Invert(&xx)) {
      is_valid_ = false;
      return;
    }
    for (int l(0); l < target_length_; ++l) {
      const int ll(source_length_ + l);
      for (int m(0); m < source_length_; ++m) {
        for (int n(0); n < source_length_; ++n) {
          e_slope_[k][l][m] += covariance_matrices[k][ll][n] * xx[n][m];
        }
      }
    }

    // Set \mu^{(Y)} - \Sigma^{(YX)} \Sigma^{(XX)}^{-1} \mu^{(X)}
    for (int l(0); l < target_length_; ++l) {
      const int ll(l + source_length_);
      double tmp(0.0);
      for (int m(0); m < source_length_; ++m) {
        tmp += e_slope_[k][l][m] * mean_vectors[k][m];
      }
      e_bias_[k][l] = mean_vectors[k][ll] - tmp;
    }

    // Set D^{(Y)}.
    for (int l(0); l < target_length_; ++l) {
      const int ll(source_length_ + l);
      for (int m(0); m <= l; ++m) {
        const int mm(source_length_ + m);
        double tmp(0.0);
        for (int n(0); n < source_length_; ++n) {
          tmp += e_slope_[k][l][n] * covariance_matrices[k][n][mm];
        }
        d_[k][l][m] = covariance_matrices[k][ll][mm] - tmp;
      }
    }
  }
}